

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O0

void nn_ep_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_ep *ep;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    (**(code **)(local_28 + 0x120))(*(undefined8 *)(local_28 + 0x118));
    *(undefined4 *)(local_28 + 0x58) = 3;
  }
  else {
    if (*(int *)(local_28 + 0x58) != 3) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/ep.c"
              ,0x9e);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((in_ESI == 0xfffffffe) && (in_EDX == 1)) {
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped((nn_fsm *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
  }
  return;
}

Assistant:

static void nn_ep_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ep *ep;

    ep = nn_cont (self, struct nn_ep, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        ep->ops.stop (ep->tran);
        ep->state = NN_EP_STATE_STOPPING;
        return;
    }
    if (nn_slow (ep->state == NN_EP_STATE_STOPPING)) {
        if (src != NN_FSM_ACTION || type != NN_EP_ACTION_STOPPED)
            return;
        ep->state = NN_EP_STATE_IDLE;
        nn_fsm_stopped (&ep->fsm, NN_EP_STOPPED);
        return;
    }

    nn_fsm_bad_state (ep->state, src, type);
}